

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_ods.c
# Opt level: O0

int rf_open(rf_dev_t *dev,char *spi_path)

{
  int iVar1;
  int *piVar2;
  byte local_29;
  int tmp_errno;
  int iStack_24;
  uint8_t val;
  int fd;
  int err;
  char *spi_path_local;
  rf_dev_t *dev_local;
  
  iStack_24 = 1;
  _fd = spi_path;
  spi_path_local = (char *)dev;
  tmp_errno = open(spi_path,2);
  if (tmp_errno == -1) {
    dev_local._4_4_ = 0x10010001;
  }
  else {
    *(int *)spi_path_local = tmp_errno;
    iStack_24 = spi_read_reg(*(int *)spi_path_local,'\x10',&local_29);
    if (iStack_24 == 0) {
      if ((local_29 & 0xf0) == 0x20) {
        iStack_24 = _sync_config((rf_dev_t *)spi_path_local);
        if (iStack_24 == 0) {
          return 0;
        }
      }
      else {
        iStack_24 = 0x20001;
      }
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    rf_close((rf_dev_t *)spi_path_local);
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    dev_local._4_4_ = iStack_24;
  }
  return dev_local._4_4_;
}

Assistant:

int rf_open(rf_dev_t *dev, const char *spi_path)
{
	int err = ERR_UNSPEC;
	int fd;
	uint8_t val;

	fd = open(spi_path, O_RDWR);
	if (fd == -1) {
		return ERR_SPI_OPEN_DEV;
	}

	dev->fd = fd;

	// Check device version
	TRY(spi_read_reg(dev->fd, RegVersion, &val));
	if ((val & SX1231_VERSION_MASK) != SX1231_VERSION) {
		err = ERR_RFM_CHIP_VERSION;
		goto fail;
	}

	// Read config
	TRY(_sync_config(dev));

	return ERR_OK;
fail:
	SAVE_ERRNO(rf_close(dev));
	return err;
}